

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapped_transform.cc
# Opt level: O2

void __thiscall
webrtc::LappedTransform::BlockThunk::ProcessBlock
          (BlockThunk *this,float **input,size_t num_frames,size_t num_input_channels,
          size_t num_output_channels,float **output)

{
  RealFourier *pRVar1;
  LappedTransform *pLVar2;
  int iVar3;
  string *result;
  float *pfVar4;
  complex<float> *pcVar5;
  float *__src;
  size_t i;
  ulong uVar6;
  size_t i_1;
  size_t num_frames_local;
  size_t num_output_channels_local;
  size_t num_input_channels_local;
  float **local_1b8;
  size_t block_length;
  FatalMessage local_1a8;
  
  num_frames_local = num_frames;
  num_output_channels_local = num_output_channels;
  num_input_channels_local = num_input_channels;
  local_1b8 = output;
  result = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                     (&num_input_channels_local,&this->parent_->num_in_channels_,
                      "num_input_channels == parent_->num_in_channels_");
  if (result == (string *)0x0) {
    result = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                       (&num_output_channels_local,&this->parent_->num_out_channels_,
                        "num_output_channels == parent_->num_out_channels_");
    if (result == (string *)0x0) {
      result = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                         (&this->parent_->block_length_,&num_frames_local,
                          "parent_->block_length_ == num_frames");
      if (result == (string *)0x0) {
        for (uVar6 = 0; uVar6 < num_input_channels_local; uVar6 = uVar6 + 1) {
          pfVar4 = AlignedArray<float>::Row(&this->parent_->real_buf_,uVar6);
          memcpy(pfVar4,input[uVar6],num_frames_local << 2);
          pRVar1 = (this->parent_->fft_)._M_t.
                   super___uniq_ptr_impl<webrtc::RealFourier,_std::default_delete<webrtc::RealFourier>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_webrtc::RealFourier_*,_std::default_delete<webrtc::RealFourier>_>
                   .super__Head_base<0UL,_webrtc::RealFourier_*,_false>._M_head_impl;
          pfVar4 = AlignedArray<float>::Row(&this->parent_->real_buf_,uVar6);
          pcVar5 = AlignedArray<std::complex<float>_>::Row(&this->parent_->cplx_pre_,uVar6);
          (*pRVar1->_vptr_RealFourier[2])(pRVar1,pfVar4,pcVar5);
        }
        iVar3 = RealFourier::FftOrder(num_frames_local);
        block_length = RealFourier::ComplexLength(iVar3);
        result = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                           (&this->parent_->cplx_length_,&block_length,
                            "parent_->cplx_length_ == block_length");
        if (result == (string *)0x0) {
          pLVar2 = this->parent_;
          (*pLVar2->block_processor_->_vptr_Callback[2])
                    (pLVar2->block_processor_,(pLVar2->cplx_pre_).head_row_,num_input_channels_local
                     ,pLVar2->cplx_length_,num_output_channels_local,(pLVar2->cplx_post_).head_row_)
          ;
          for (uVar6 = 0; uVar6 < num_output_channels_local; uVar6 = uVar6 + 1) {
            pRVar1 = (this->parent_->fft_)._M_t.
                     super___uniq_ptr_impl<webrtc::RealFourier,_std::default_delete<webrtc::RealFourier>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_webrtc::RealFourier_*,_std::default_delete<webrtc::RealFourier>_>
                     .super__Head_base<0UL,_webrtc::RealFourier_*,_false>._M_head_impl;
            pcVar5 = AlignedArray<std::complex<float>_>::Row(&this->parent_->cplx_post_,uVar6);
            pfVar4 = AlignedArray<float>::Row(&this->parent_->real_buf_,uVar6);
            (*pRVar1->_vptr_RealFourier[3])(pRVar1,pcVar5,pfVar4);
            pfVar4 = local_1b8[uVar6];
            __src = AlignedArray<float>::Row(&this->parent_->real_buf_,uVar6);
            memcpy(pfVar4,__src,num_frames_local << 2);
          }
          return;
        }
        iVar3 = 0x28;
      }
      else {
        iVar3 = 0x1d;
      }
    }
    else {
      iVar3 = 0x1c;
    }
  }
  else {
    iVar3 = 0x1b;
  }
  rtc::FatalMessage::FatalMessage
            (&local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
             ,iVar3,result);
  rtc::FatalMessage::~FatalMessage(&local_1a8);
}

Assistant:

void LappedTransform::BlockThunk::ProcessBlock(const float* const* input,
                                               size_t num_frames,
                                               size_t num_input_channels,
                                               size_t num_output_channels,
                                               float* const* output) {
  RTC_CHECK_EQ(num_input_channels, parent_->num_in_channels_);
  RTC_CHECK_EQ(num_output_channels, parent_->num_out_channels_);
  RTC_CHECK_EQ(parent_->block_length_, num_frames);

  for (size_t i = 0; i < num_input_channels; ++i) {
    memcpy(parent_->real_buf_.Row(i), input[i],
           num_frames * sizeof(*input[0]));
    parent_->fft_->Forward(parent_->real_buf_.Row(i),
                           parent_->cplx_pre_.Row(i));
  }

  size_t block_length = RealFourier::ComplexLength(
      RealFourier::FftOrder(num_frames));
  RTC_CHECK_EQ(parent_->cplx_length_, block_length);
  parent_->block_processor_->ProcessAudioBlock(parent_->cplx_pre_.Array(),
                                               num_input_channels,
                                               parent_->cplx_length_,
                                               num_output_channels,
                                               parent_->cplx_post_.Array());

  for (size_t i = 0; i < num_output_channels; ++i) {
    parent_->fft_->Inverse(parent_->cplx_post_.Row(i),
                           parent_->real_buf_.Row(i));
    memcpy(output[i], parent_->real_buf_.Row(i),
           num_frames * sizeof(*input[0]));
  }
}